

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speedtesting.cpp
# Opt level: O0

double hashALot<ThreeWiseHash<unsigned_int,unsigned_char>>
                 (int n,int L,uint ttimes,uint sizeoftest,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *recorder)

{
  int iVar1;
  uint local_4d8;
  uint k_1;
  uint local_4c4;
  undefined1 local_4c0 [4];
  uint k;
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  undefined1 local_40 [4];
  uint times;
  ZTimer t;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *recorder_local;
  uint sizeoftest_local;
  uint ttimes_local;
  int L_local;
  int n_local;
  
  t.t2.tv_usec = (__suseconds_t)recorder;
  ZTimer::ZTimer((ZTimer *)local_40);
  for (hf.hasher.hashvalues[0xff] = 0; hf.hasher.hashvalues[0xff] < ttimes;
      hf.hasher.hashvalues[0xff] = hf.hasher.hashvalues[0xff] + 1) {
    ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash
              ((ThreeWiseHash<unsigned_int,_unsigned_char> *)local_4c0,n,L);
    for (local_4c4 = 0; local_4d8 = n, local_4c4 < (uint)n; local_4c4 = local_4c4 + 1) {
      ThreeWiseHash<unsigned_int,_unsigned_char>::eat
                ((ThreeWiseHash<unsigned_int,_unsigned_char> *)local_4c0,(uchar)local_4c4);
    }
    for (; local_4d8 < sizeoftest; local_4d8 = local_4d8 + 1) {
      ThreeWiseHash<unsigned_int,_unsigned_char>::update
                ((ThreeWiseHash<unsigned_int,_unsigned_char> *)local_4c0,(uchar)local_4d8 - (char)n,
                 (uchar)local_4d8);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)t.t2.tv_usec,
               (value_type_conflict1 *)local_4c0);
    ThreeWiseHash<unsigned_int,_unsigned_char>::~ThreeWiseHash
              ((ThreeWiseHash<unsigned_int,_unsigned_char> *)local_4c0);
  }
  iVar1 = ZTimer::split((ZTimer *)local_40);
  return (double)iVar1 / ((double)ttimes * 1000.0);
}

Assistant:

double hashALot(int n, int L, uint ttimes, uint sizeoftest,
                vector<uint32> &recorder) {
  ZTimer t;
  for (uint times = 0; times < ttimes; ++times) {
    hashfunction hf(n, L);
    for (uint k = 0; k < static_cast<uint>(n); ++k) {
      hf.eat(static_cast<unsigned char>(k));
    }
    for (uint k = n; k < sizeoftest; ++k) {
      hf.update(static_cast<unsigned char>(k - n),
                static_cast<unsigned char>(k));
    }
    /* The goal of the recorder is to prevent
    the compiler from deciding that this whole computation
    is not required!
    */
    recorder.push_back(hf.hashvalue);
  }
  return t.split() / (1000.0 * ttimes);
}